

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.hpp
# Opt level: O2

void __thiscall
duckdb::ListLambdaBindData::ListLambdaBindData
          (ListLambdaBindData *this,LogicalType *return_type,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *lambda_expr
          ,bool has_index,bool has_initial)

{
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__ListLambdaBindData_027d37d8;
  LogicalType::LogicalType(&this->return_type,return_type);
  (this->lambda_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (lambda_expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (lambda_expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
  .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  this->has_index = has_index;
  this->has_initial = has_initial;
  return;
}

Assistant:

ListLambdaBindData(const LogicalType &return_type, unique_ptr<Expression> lambda_expr, const bool has_index = false,
	                   const bool has_initial = false)
	    : return_type(return_type), lambda_expr(std::move(lambda_expr)), has_index(has_index),
	      has_initial(has_initial) {}